

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileParser::getObjectName(ObjFileParser *this)

{
  byte *pbVar1;
  __type _Var2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  Model *pMVar5;
  pointer ppOVar6;
  string strObjectName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  _Var3 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var3._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  _Var4 = _Var3;
  if ((byte *)_Var3._M_current != pbVar1) {
    while (((byte *)_Var4._M_current != pbVar1 &&
           ((0x20 < (ulong)(byte)*_Var4._M_current ||
            ((0x100003601U >> ((ulong)(byte)*_Var4._M_current & 0x3f) & 1) == 0))))) {
      (this->m_DataIt)._M_current = (char *)((byte *)_Var4._M_current + 1);
      _Var4._M_current = (char *)((byte *)_Var4._M_current + 1);
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_38,_Var3._M_current);
    if (local_38._M_string_length != 0) {
      ((this->m_pModel)._M_t.
       super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
       _M_t.
       super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
       .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrent =
           (Object *)0x0;
      pMVar5 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      for (ppOVar6 = *(pointer *)
                      &(pMVar5->m_Objects).
                       super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                       ._M_impl;
          ppOVar6 !=
          *(pointer *)
           ((long)&(pMVar5->m_Objects).
                   super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                   ._M_impl + 8); ppOVar6 = ppOVar6 + 1) {
        _Var2 = std::operator==(&(*ppOVar6)->m_strObjName,&local_38);
        pMVar5 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
        if (_Var2) {
          pMVar5->m_pCurrent = *ppOVar6;
          pMVar5 = (this->m_pModel)._M_t.
                   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                   .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
          break;
        }
      }
      if (pMVar5->m_pCurrent == (Object *)0x0) {
        createObject(this,&local_38);
      }
    }
    _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
    (this->m_DataIt)._M_current = _Var4._M_current;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void ObjFileParser::getObjectName()
{
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }
    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }

    std::string strObjectName(pStart, &(*m_DataIt));
    if (!strObjectName.empty())
    {
        // Reset current object
        m_pModel->m_pCurrent = NULL;

        // Search for actual object
        for (std::vector<ObjFile::Object*>::const_iterator it = m_pModel->m_Objects.begin();
            it != m_pModel->m_Objects.end();
            ++it)
        {
            if ((*it)->m_strObjName == strObjectName)
            {
                m_pModel->m_pCurrent = *it;
                break;
            }
        }

        // Allocate a new object, if current one was not found before
        if( NULL == m_pModel->m_pCurrent ) {
            createObject( strObjectName );
        }
    }
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}